

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

void __thiscall Fl_Help_View::end_selection(Fl_Help_View *this,int clipboard)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  wchar_t wVar6;
  size_t sVar7;
  EVP_PKEY_CTX *dst;
  char *p_00;
  char *pcVar8;
  uint local_78;
  int n;
  char cc;
  int xx;
  char *s2;
  int n_1;
  int c;
  char *src;
  char *cmd;
  char *s;
  char *d;
  char *txt;
  int len;
  char pre;
  int p;
  int clipboard_local;
  Fl_Help_View *this_local;
  
  if ((selected != 0) && (current_view == this)) {
    len = 0;
    bVar2 = false;
    sVar7 = strlen(this->value_);
    dst = (EVP_PKEY_CTX *)malloc((long)((int)sVar7 + 1));
    cmd = this->value_;
    s = (char *)dst;
    do {
      while( true ) {
        p_00 = cmd + 1;
        s2._4_4_ = (uint)(byte)*cmd;
        if (s2._4_4_ == 0) goto LAB_001f123a;
        cmd = p_00;
        if (s2._4_4_ != 0x3c) break;
        do {
          pcVar8 = cmd + 1;
          cVar1 = *cmd;
          cmd = pcVar8;
          if (cVar1 == '\0') break;
        } while (cVar1 != '>');
        if (cVar1 == '\0') goto LAB_001f123a;
        _n_1 = (char *)0x0;
        uVar3 = command(p_00);
        if ((((uVar3 == 0x2f683100) || (uVar3 == 0x2f683200)) || (uVar3 == 0x2f683300)) ||
           (((uVar3 == 0x2f683400 || (uVar3 == 0x2f683500)) || (uVar3 == 0x2f683600)))) {
          _n_1 = "\n\n";
        }
        else if (uVar3 == 0x2f700000) {
LAB_001f104e:
          _n_1 = "\n";
        }
        else if (uVar3 == 0x2f707265) {
          bVar2 = false;
        }
        else {
          if (uVar3 == 0x62720000) goto LAB_001f104e;
          if (uVar3 == 0x64640000) {
            _n_1 = "\n - ";
          }
          else if (uVar3 == 0x64740000) {
            _n_1 = "\n ";
          }
          else if (((uVar3 == 0x68310000) || (uVar3 == 0x68320000)) ||
                  ((uVar3 == 0x68330000 ||
                   (((uVar3 == 0x68340000 || (uVar3 == 0x68350000)) || (uVar3 == 0x68360000)))))) {
LAB_001f1075:
            _n_1 = "\n\n";
          }
          else if (uVar3 == 0x6c690000) {
            _n_1 = "\n * ";
          }
          else {
            if (uVar3 == 0x70000000) goto LAB_001f104e;
            if (uVar3 == 0x70726500) {
              bVar2 = true;
            }
            else {
              if (uVar3 == 0x74640000) goto LAB_001f104e;
              if (uVar3 == 0x74720000) goto LAB_001f1075;
            }
          }
        }
        iVar4 = (int)pcVar8 - (int)this->value_;
        if (((_n_1 != (char *)0x0) && (selection_first < iVar4)) && (iVar4 <= selection_last)) {
          while (*_n_1 != '\0') {
            *s = *_n_1;
            _n_1 = _n_1 + 1;
            s = s + 1;
          }
          local_78 = (uint)(byte)_n_1[-1];
          iVar4 = isspace(local_78);
          if (iVar4 != 0) {
            local_78 = 0x20;
          }
          len = local_78;
        }
      }
      if ((s2._4_4_ == 0x26) && (uVar3 = quote_char(p_00), -1 < (int)uVar3)) {
        do {
          pcVar8 = cmd + 1;
          cVar1 = *cmd;
          s2._4_4_ = uVar3;
          cmd = pcVar8;
          if (cVar1 == '\0') break;
        } while (cVar1 != ';');
      }
      iVar4 = (int)p_00 - (int)this->value_;
      if ((selection_first < iVar4) && (iVar4 <= selection_last)) {
        if ((!bVar2) && (((int)s2._4_4_ < 0x100 && (iVar5 = isspace(s2._4_4_), iVar5 != 0)))) {
          s2._4_4_ = 0x20;
        }
        if ((len != 0x20) || (s2._4_4_ != 0x20)) {
          if (p_00 == cmd) {
            *s = (char)s2._4_4_;
            s = s + 1;
          }
          else {
            wVar6 = fl_utf8encode(s2._4_4_,s);
            s = s + wVar6;
          }
        }
        len = s2._4_4_;
      }
    } while (iVar4 <= selection_last);
LAB_001f123a:
    *s = '\0';
    sVar7 = strlen((char *)dst);
    Fl::copy(dst,(EVP_PKEY_CTX *)(sVar7 & 0xffffffff));
    free(dst);
  }
  return;
}

Assistant:

void Fl_Help_View::end_selection(int clipboard)
{
  if (!selected || current_view!=this)
    return;
  // convert the select part of our html text into some kind of somewhat readable UTF-8
  // and store it in the selection buffer
  int p = 0;
  char pre = 0;
  int len = (int) strlen(value_);
  char *txt = (char*)malloc(len+1), *d = txt;
  const char *s = value_, *cmd, *src;
  for (;;) {
    int c = (*s++) & 0xff;
    if (c==0) break;
    if (c=='<') { // begin of some html command. Skip until we find a '>'
      cmd = s;
      for (;;) {
        c = (*s++) & 0xff;
        if (c==0 || c=='>') break;
      }
      if (c==0) break;
      // do something with this command... .
      // The replacement string must not be longer than the command
      // itself plus '<' and '>'
      src = 0;
      switch (command(cmd)) {
        case CMD('p','r','e', 0 ): pre = 1; break;
        case CMD('/','p','r','e'): pre = 0; break;
        case CMD('t','d', 0 , 0 ):
        case CMD('p', 0 , 0 , 0 ):
        case CMD('/','p', 0 , 0 ):
        case CMD('b','r', 0 , 0 ): src = "\n"; break;
        case CMD('l','i', 0 , 0 ): src = "\n * "; break;
        case CMD('/','h','1', 0 ):
        case CMD('/','h','2', 0 ):
        case CMD('/','h','3', 0 ):
        case CMD('/','h','4', 0 ):
        case CMD('/','h','5', 0 ):
        case CMD('/','h','6', 0 ): src = "\n\n"; break;
        case CMD('t','r', 0 , 0 ):
        case CMD('h','1', 0 , 0 ):
        case CMD('h','2', 0 , 0 ):
        case CMD('h','3', 0 , 0 ):
        case CMD('h','4', 0 , 0 ):
        case CMD('h','5', 0 , 0 ):
        case CMD('h','6', 0 , 0 ): src = "\n\n"; break;
        case CMD('d','t', 0 , 0 ): src = "\n "; break;
        case CMD('d','d', 0 , 0 ): src = "\n - "; break;
      }
      int n = (int) (s-value_);
      if (src && n>selection_first && n<=selection_last) {
        while (*src) {
          *d++ = *src++;
        }
        c = src[-1] & 0xff;
        p = isspace(c) ? ' ' : c;
      }
      continue;
    }
    const char *s2 = s;
    if (c=='&') { // special characters (HTML entities)
      int xx = quote_char(s);
      if (xx >= 0) {
        c = xx;
        for (;;) {
          char cc = *s++;
          if (!cc || cc==';') break;
        }
      }
    }
    int n = (int) (s2-value_);
    if (n>selection_first && n<=selection_last) {
      if (!pre && c < 256 && isspace(c)) c = ' ';
      if (p != ' ' || c != ' ') {
        if (s2 != s) { // c was an HTML entity
          d += fl_utf8encode(c, d);
        }
        else *d++ = c;
      }
      p = c;
    }
    if (n>selection_last) break; // stop parsing html after end of selection
  }
  *d = 0;
  Fl::copy(txt, (int) strlen(txt), clipboard);
  // printf("copy [%s]\n", txt);
  free(txt);
}